

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicalSystem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::DynamicalSystem::DynamicalSystem
          (DynamicalSystem *this,size_t stateSpaceSize,size_t controlSpaceSize)

{
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__DynamicalSystem_003fa4a8;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 3),in_RSI & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 7),in_RDX & 0xffffffff);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

DynamicalSystem::DynamicalSystem(size_t stateSpaceSize,
                                         size_t controlSpaceSize)
        : m_stateSize(stateSpaceSize)
        , m_controlSize(controlSpaceSize)
        , m_initialState(static_cast<unsigned int>(stateSpaceSize))
        , m_controlInput(static_cast<unsigned int>(controlSpaceSize))
        {
            m_initialState.zero();
            m_controlInput.zero();
        }